

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l,CBString *sep)

{
  int iVar1;
  int *piVar2;
  CBStringException *pCVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int len;
  ulong uVar8;
  CBStringException bstr__cppwrapper_exception;
  CBStringException CStack_b8;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->super_tagbstring).mlen < 1) {
LAB_00158800:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"CBString::Write protection error","");
    CBStringException::CBStringException(&CStack_b8,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&CStack_b8);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  lVar4 = *(long *)(l + 8) - *(long *)l;
  if (lVar4 == 0) {
    len = 1;
  }
  else {
    iVar1 = (sep->super_tagbstring).slen;
    lVar4 = (lVar4 >> 3) * -0x5555555555555555;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    piVar2 = (int *)(*(long *)l + 0xc);
    len = 1;
    do {
      len = len + iVar1 + *piVar2;
      if (len < iVar1) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"CBString::Failure in (CBStringList) constructor, too long",
                   "");
        CBStringException::CBStringException(&CStack_b8,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
        CBStringException::CBStringException(pCVar3,&CStack_b8);
        __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
      }
      piVar2 = piVar2 + 6;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  alloc(this,len);
  (this->super_tagbstring).slen = 0;
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"CBString::Failure in (CBStringList) constructor","");
    CBStringException::CBStringException(&CStack_b8,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&CStack_b8);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  lVar4 = *(long *)l;
  lVar5 = *(long *)(l + 8);
  if (lVar5 != lVar4) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      if (uVar8 != 0) {
        operator+=(this,sep);
        lVar4 = *(long *)l;
        lVar5 = *(long *)(l + 8);
      }
      uVar6 = (lVar5 - lVar4 >> 3) * -0x5555555555555555;
      if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
        goto LAB_00158800;
      }
      operator+=(this,(CBString *)(lVar4 + lVar7));
      uVar8 = uVar8 + 1;
      lVar4 = *(long *)l;
      lVar5 = *(long *)(l + 8);
      lVar7 = lVar7 + 0x18;
    } while (uVar8 < (ulong)((lVar5 - lVar4 >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

void CBString::join (const struct CBStringList& l, const CBString& sep) {
int c, sl = sep.length();
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + sl;
		if (c < sl) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}